

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall
loltoml::v_0_1_1::detail::parser_t<comments_skipper_t>::parse_kv_pair
          (parser_t<comments_skipper_t> *this)

{
  events_aggregator_t *this_00;
  string sStack_38;
  
  this_00 = &this->handler->super_events_aggregator_t;
  parse_key_abi_cxx11_(&sStack_38,this);
  events_aggregator_t::key(this_00,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  skip_spaces(this);
  parse_chars<2ul>(this,(char (*) [2])0x18e4a9);
  skip_spaces(this);
  parse_value(this);
  return;
}

Assistant:

void parse_kv_pair() {
        handler.key(parse_key());
        skip_spaces();
        parse_chars("=");
        skip_spaces();
        parse_value();
    }